

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parser::extractBracketArguments
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Parser *this,string *data)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  string *psVar6;
  uint uVar7;
  uint uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ulong uVar9;
  size_type sVar10;
  uint uVar11;
  int iVar12;
  pointer pbVar13;
  string argumentBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pcVar4 = (data->_M_dataplus)._M_p;
  if (*pcVar4 == '(') {
    std::__cxx11::string::erase((ulong)data,0);
    pcVar4 = (data->_M_dataplus)._M_p;
  }
  sVar10 = data->_M_string_length;
  if (pcVar4[sVar10 - 1] == ')') {
    std::__cxx11::string::erase((ulong)data,sVar10 - 1);
    sVar10 = data->_M_string_length;
  }
  if (sVar10 != 0) {
    iVar12 = 0;
    uVar5 = 0;
    uVar9 = 1;
    uVar7 = 0;
    do {
      cVar1 = (data->_M_dataplus)._M_p[uVar5];
      uVar8 = (uint)(~(byte)uVar7 & 1);
      uVar11 = uVar7;
      if (cVar1 == '\"') {
        uVar11 = uVar8;
      }
      if (cVar1 == '(') {
        iVar12 = iVar12 + uVar8;
LAB_0010e2b9:
        std::__cxx11::string::push_back((char)&local_50);
      }
      else {
        if (cVar1 == ')') {
          if (uVar7 == 0) {
            if (iVar12 < 1) {
              psVar6 = (string *)__cxa_allocate_exception(0x20);
              *(string **)psVar6 = psVar6 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>(psVar6,"Bracket mismatch","");
              __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            iVar12 = iVar12 + -1;
          }
          goto LAB_0010e2b9;
        }
        if ((((cVar1 != ',') || (local_50._M_string_length == 0)) || (iVar12 != 0)) || (uVar7 != 0))
        goto LAB_0010e2b9;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
        local_50._M_string_length = 0;
        *local_50._M_dataplus._M_p = '\0';
        iVar12 = 0;
      }
      bVar3 = uVar9 < data->_M_string_length;
      uVar5 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar7 = uVar11;
    } while (bVar3);
  }
  if (local_50._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
  }
  pbVar2 = (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = (__return_storage_ptr__->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar2;
      pbVar13 = pbVar13 + 1) {
    while (*(pbVar13->_M_dataplus)._M_p == ' ') {
      std::__cxx11::string::erase((ulong)pbVar13,0);
    }
    while ((pbVar13->_M_dataplus)._M_p[pbVar13->_M_string_length - 1] == ' ') {
      std::__cxx11::string::erase((ulong)pbVar13,pbVar13->_M_string_length - 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Parser::extractBracketArguments(std::string data)
{
    std::vector<std::string> arguments;
    std::string argumentBuffer;
    bool isQuoteOpen = false;
    int bracketDepth = 0;

    //Take off surrounding brackets if any as these aren't needed in the split results
    if(data[0] == '(')
        data.erase(0,1);
    if(data[data.size()-1] == ')')
        data.erase(data.size()-1, 1);

    //Go through each character and split each argument into a separate vector element
    for(unsigned int c = 0; c < data.size(); c++) //Ignore opening and close brackets
    {
        if(data[c] == '"')
            isQuoteOpen = !isQuoteOpen;
        if(data[c] == '(' && !isQuoteOpen)
            bracketDepth++;
        else if(data[c] == ')' && !isQuoteOpen)
            bracketDepth--;
        if(bracketDepth < 0)
            throw std::string("Bracket mismatch");
        if(data[c] == ',' && !argumentBuffer.empty() && !isQuoteOpen && bracketDepth == 0)
        {
            arguments.emplace_back(argumentBuffer);
            argumentBuffer.clear();
        }
        else
        {
            argumentBuffer += data[c];
        }
    }
    if(!argumentBuffer.empty())
        arguments.emplace_back(argumentBuffer);

    //Fix the spacing
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0,1);
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
    }

    return arguments;
}